

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcWriteVer.c
# Opt level: O2

void Wlc_WriteVer(Wlc_Ntk_t *p,char *pFileName,int fAddCos,int fNoFlops)

{
  char *pcVar1;
  FILE *__stream;
  char *pcVar2;
  char *pcVar3;
  
  __stream = fopen(pFileName,"w");
  if (__stream != (FILE *)0x0) {
    pcVar1 = p->pName;
    pcVar3 = "unknown";
    if (p->pSpec != (char *)0x0) {
      pcVar3 = p->pSpec;
    }
    pcVar2 = Extra_TimeStamp();
    fprintf(__stream,"// Benchmark \"%s\" from file \"%s\" written by ABC on %s\n",pcVar1,pcVar3,
            pcVar2);
    fputc(10,__stream);
    Wlc_WriteTables((FILE *)__stream,p);
    if (fAddCos != 0) {
      Wlc_WriteAddPos(p);
    }
    Wlc_WriteVerInt((FILE *)__stream,p,fNoFlops);
    fputc(10,__stream);
    fclose(__stream);
    return;
  }
  fprintf(_stdout,"Wlc_WriteVer(): Cannot open the output file \"%s\".\n",pFileName);
  return;
}

Assistant:

void Wlc_WriteVer( Wlc_Ntk_t * p, char * pFileName, int fAddCos, int fNoFlops )
{
    FILE * pFile;
    pFile = fopen( pFileName, "w" );
    if ( pFile == NULL )
    {
        fprintf( stdout, "Wlc_WriteVer(): Cannot open the output file \"%s\".\n", pFileName );
        return;
    }
    fprintf( pFile, "// Benchmark \"%s\" from file \"%s\" written by ABC on %s\n", p->pName, p->pSpec ? p->pSpec : "unknown", Extra_TimeStamp() );
    fprintf( pFile, "\n" );
    Wlc_WriteTables( pFile, p );
    if ( fAddCos )
        Wlc_WriteAddPos( p );
    Wlc_WriteVerInt( pFile, p, fNoFlops );
    fprintf( pFile, "\n" );
    fclose( pFile );
}